

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync
          (MapFieldBase *this,MapKey *map_key,MapValueRef *val)

{
  UntypedMapBase *this_00;
  bool bVar1;
  void *val_00;
  NodeBase **in_R8;
  anon_class_16_2_3fe397bd f;
  atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> local_38;
  NodeBase *node;
  UntypedMapBase *map;
  MapValueRef *val_local;
  MapKey *map_key_local;
  MapFieldBase *this_local;
  
  map = (UntypedMapBase *)val;
  val_local = (MapValueRef *)map_key;
  map_key_local = (MapKey *)this;
  bVar1 = LookupMapValueNoSync(this,map_key,&val->super_MapValueConstRef);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    node = (NodeBase *)MapFieldBaseForParse::GetMapRaw(&this->super_MapFieldBaseForParse);
    local_38._M_i = (TaggedPtr)UntypedMapBase::AllocNode((UntypedMapBase *)node);
    UntypedMapBase::
    VisitValue<google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)::__0>
              ((UntypedMapBase *)node,(NodeBase *)local_38._M_i,(anon_class_8_1_8991fb9c)this);
    this_00 = map;
    val_00 = UntypedMapBase::GetVoidValue((UntypedMapBase *)node,(NodeBase *)local_38._M_i);
    MapValueConstRef::SetValue((MapValueConstRef *)this_00,val_00);
    f.node = in_R8;
    f.this = (MapFieldBase *)&stack0xffffffffffffffc8;
    this_local._7_1_ =
         VisitMapKey<google::protobuf::internal::UntypedMapBase,google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)::__1>
                   ((internal *)val_local,(MapKey *)node,(UntypedMapBase *)this,f);
  }
  return this_local._7_1_;
}

Assistant:

bool MapFieldBase::InsertOrLookupMapValueNoSync(const MapKey& map_key,
                                                MapValueRef* val) {
  if (LookupMapValueNoSync(map_key, static_cast<MapValueConstRef*>(val))) {
    return false;
  }

  auto& map = GetMapRaw();

  NodeBase* node = map.AllocNode();
  map.VisitValue(node, [&](auto* v) { InitializeKeyValue(v); });
  val->SetValue(map.GetVoidValue(node));

  return VisitMapKey(map_key, map, [&](auto& map, const auto& key) {
    InitializeKeyValue(map.GetKey(node), key);
    map.InsertOrReplaceNode(
        static_cast<typename std::decay_t<decltype(map)>::KeyNode*>(node));
    return true;
  });
}